

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O3

_Bool run_container_remove(run_container_t *run,uint16_t pos)

{
  ushort uVar1;
  uint16_t uVar2;
  rle16_t *prVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  iVar7 = run->n_runs;
  uVar8 = 0;
  if (iVar7 < 1) goto LAB_001031f7;
  prVar3 = run->runs;
  iVar5 = iVar7 + -1;
  do {
    uVar4 = (uint)(iVar5 + (int)uVar8) >> 1;
    if (prVar3[uVar4].value < pos) {
      uVar8 = (ulong)(uVar4 + 1);
    }
    else {
      if (prVar3[uVar4].value <= pos) {
        uVar2 = prVar3[uVar4].length;
        if (uVar2 == 0) {
          memmove(prVar3 + (ushort)uVar4,prVar3 + (ulong)(ushort)uVar4 + 1,
                  (long)(int)(iVar7 + ~(uVar4 & 0xffff)) << 2);
          run->n_runs = run->n_runs + -1;
        }
        else {
          prVar3[uVar4].value = prVar3[uVar4].value + 1;
          prVar3[uVar4].length = uVar2 - 1;
        }
        goto LAB_001031f4;
      }
      iVar5 = uVar4 - 1;
    }
  } while ((int)uVar8 <= iVar5);
  if ((int)uVar8 == 0) {
LAB_001031cb:
    uVar8 = 0;
  }
  else {
    uVar4 = (uint)pos - (uint)prVar3[uVar8 - 1].value;
    uVar1 = prVar3[uVar8 - 1].length;
    if ((int)uVar4 < (int)(uint)uVar1) {
      prVar3[uVar8 - 1].length = (ushort)uVar4 - 1;
      if (run->capacity <= iVar7) {
        run_container_grow(run,iVar7 + 1,true);
        iVar7 = run->n_runs;
        prVar3 = run->runs;
      }
      uVar6 = uVar8 & 0xffff;
      memmove(prVar3 + uVar6 + 1,prVar3 + uVar6,(long)(iVar7 - (int)uVar6) << 2);
      run->n_runs = run->n_runs + 1;
      prVar3 = run->runs;
      prVar3[uVar8].value = pos + 1;
      prVar3[uVar8].length = uVar1 + ~(ushort)uVar4;
    }
    else {
      if (uVar4 != uVar1) goto LAB_001031cb;
      prVar3[uVar8 - 1].length = uVar1 - 1;
    }
LAB_001031f4:
    uVar8 = 1;
  }
LAB_001031f7:
  return SUB81(uVar8,0);
}

Assistant:

static inline bool run_container_remove(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) {
        int32_t le = run->runs[index].length;
        if (le == 0) {
            recoverRoomAtIndex(run, (uint16_t)index);
        } else {
            run->runs[index].value++;
            run->runs[index].length--;
        }
        return true;
    }
    index = -index - 2;  // points to preceding value, possibly -1
    if (index >= 0) {    // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset < le) {
            // need to break in two
            run->runs[index].length = (uint16_t)(offset - 1);
            // need to insert
            uint16_t newvalue = pos + 1;
            int32_t newlength = le - offset - 1;
            makeRoomAtIndex(run, (uint16_t)(index + 1));
            run->runs[index + 1].value = newvalue;
            run->runs[index + 1].length = (uint16_t)newlength;
            return true;

        } else if (offset == le) {
            run->runs[index].length--;
            return true;
        }
    }
    // no match
    return false;
}